

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_min>
                (float v0,float *ptr,int size0,int stride0,int size1,int stride1)

{
  int in_ECX;
  int in_ESI;
  float in_XMM0_Da;
  int j;
  float *ptr0;
  int i;
  float sum;
  reduction_op_min op;
  float *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  undefined4 local_2c;
  undefined4 local_28;
  
  local_28 = in_XMM0_Da;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      local_28 = reduction_op_min::operator()
                           ((reduction_op_min *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8,(float *)0xfb2362);
    }
  }
  return local_28;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int stride0, int size1, int stride1)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size1; i++)
    {
        const float* ptr0 = ptr;
        for (int j = 0; j < size0; j++)
        {
            sum = op(sum, *ptr0);
            ptr0 += stride0;
        }
        ptr += stride1;
    }

    return sum;
}